

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_set.hxx
# Opt level: O0

iterator __thiscall
cmsys::hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_>::begin
          (hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_> *this)

{
  const_iterator cVar1;
  iterator iVar2;
  hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_> *this_local;
  
  cVar1 = hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
          ::begin(&this->_M_ht);
  iVar2._M_cur = cVar1._M_cur;
  iVar2._M_ht = cVar1._M_ht;
  return iVar2;
}

Assistant:

iterator begin() const { return _M_ht.begin(); }